

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_cpio_binary.c
# Opt level: O0

uint16_t la_swap16(uint16_t in)

{
  anon_union_4_2_94730051 U;
  uint16_t in_local;
  
  return in;
}

Assistant:

static uint16_t la_swap16(uint16_t in) {
	union {
		uint16_t s[2];
		uint8_t c[4];
	} U;
	U.s[0] = 1;
	if (U.c[0])
		return in;
	else {
		U.s[0] = in;
		U.c[2] = U.c[1];
		U.c[3] = U.c[0];
		return U.s[1];
	}
	/* NOTREACHED */
}